

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

OPJ_BOOL opj_tls_set(opj_tls_t *tls,int key,void *value,opj_tls_free_func opj_free_func)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  opj_tls_key_val_t *poVar4;
  OPJ_BOOL OVar5;
  long lVar6;
  
  uVar1 = tls->key_val_count;
  OVar5 = 0;
  if ((ulong)uVar1 != 0x7fffffff) {
    poVar4 = tls->key_val;
    if (0 < (int)uVar1) {
      lVar6 = 0;
      do {
        if (*(int *)((long)&poVar4->key + lVar6) == key) {
          pcVar3 = *(code **)((long)&poVar4->opj_free_func + lVar6);
          if (pcVar3 != (code *)0x0) {
            (*pcVar3)(*(undefined8 *)((long)&poVar4->value + lVar6));
            poVar4 = tls->key_val;
          }
          *(void **)((long)&poVar4->value + lVar6) = value;
          *(opj_tls_free_func *)((long)&poVar4->opj_free_func + lVar6) = opj_free_func;
          goto LAB_00108098;
        }
        lVar6 = lVar6 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar6);
    }
    poVar4 = (opj_tls_key_val_t *)opj_realloc(poVar4,(long)(int)uVar1 * 0x18 + 0x18);
    OVar5 = 0;
    if (poVar4 != (opj_tls_key_val_t *)0x0) {
      tls->key_val = poVar4;
      iVar2 = tls->key_val_count;
      poVar4[iVar2].key = key;
      poVar4[iVar2].value = value;
      poVar4[iVar2].opj_free_func = opj_free_func;
      tls->key_val_count = iVar2 + 1;
LAB_00108098:
      OVar5 = 1;
    }
  }
  return OVar5;
}

Assistant:

OPJ_BOOL opj_tls_set(opj_tls_t* tls, int key, void* value,
                     opj_tls_free_func opj_free_func)
{
    opj_tls_key_val_t* new_key_val;
    int i;

    if (tls->key_val_count == INT_MAX) {
        return OPJ_FALSE;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].key == key) {
            if (tls->key_val[i].opj_free_func) {
                tls->key_val[i].opj_free_func(tls->key_val[i].value);
            }
            tls->key_val[i].value = value;
            tls->key_val[i].opj_free_func = opj_free_func;
            return OPJ_TRUE;
        }
    }
    new_key_val = (opj_tls_key_val_t*) opj_realloc(tls->key_val,
                  ((size_t)tls->key_val_count + 1U) * sizeof(opj_tls_key_val_t));
    if (!new_key_val) {
        return OPJ_FALSE;
    }
    tls->key_val = new_key_val;
    new_key_val[tls->key_val_count].key = key;
    new_key_val[tls->key_val_count].value = value;
    new_key_val[tls->key_val_count].opj_free_func = opj_free_func;
    tls->key_val_count ++;
    return OPJ_TRUE;
}